

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Shutdown(void)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  char *in_stack_00000010;
  ImGuiContextHookType in_stack_0000001c;
  ImGuiContext *in_stack_00000020;
  
  pIVar1 = GImGui;
  if (((GImGui->IO).Fonts != (ImFontAtlas *)0x0) && ((GImGui->FontAtlasOwnedByContext & 1U) != 0)) {
    ((GImGui->IO).Fonts)->Locked = false;
    IM_DELETE<ImFontAtlas>((ImFontAtlas *)0x49c78a);
  }
  (pIVar1->IO).Fonts = (ImFontAtlas *)0x0;
  ImVector<ImVec2>::clear((ImVector<ImVec2> *)g);
  if ((pIVar1->Initialized & 1U) != 0) {
    if (((pIVar1->SettingsLoaded & 1U) != 0) && ((pIVar1->IO).IniFilename != (char *)0x0)) {
      SaveIniSettingsToDisk(in_stack_00000010);
    }
    CallContextHooks(in_stack_00000020,in_stack_0000001c);
    ImVector<ImGuiWindow_*>::clear_delete((ImVector<ImGuiWindow_*> *)g);
    ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)g);
    ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)g);
    pIVar1->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindowStackData>::clear((ImVector<ImGuiWindowStackData> *)g);
    ImGuiStorage::Clear((ImGuiStorage *)0x49c84a);
    pIVar1->NavWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar1->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    pIVar1->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar1->MovingWindow = (ImGuiWindow *)0x0;
    ImGuiKeyRoutingTable::Clear((ImGuiKeyRoutingTable *)g);
    ImVector<ImGuiColorMod>::clear((ImVector<ImGuiColorMod> *)g);
    ImVector<ImGuiStyleMod>::clear((ImVector<ImGuiStyleMod> *)g);
    ImVector<ImFont_*>::clear((ImVector<ImFont_*> *)g);
    ImVector<ImGuiPopupData>::clear((ImVector<ImGuiPopupData> *)g);
    ImVector<ImGuiPopupData>::clear((ImVector<ImGuiPopupData> *)g);
    ImVector<ImGuiViewportP_*>::clear_delete((ImVector<ImGuiViewportP_*> *)g);
    ImPool<ImGuiTabBar>::Clear((ImPool<ImGuiTabBar> *)g);
    ImVector<ImGuiPtrOrIndex>::clear((ImVector<ImGuiPtrOrIndex> *)g);
    ImVector<ImGuiShrinkWidthItem>::clear((ImVector<ImGuiShrinkWidthItem> *)g);
    ImVector<ImGuiListClipperData>::clear_destruct((ImVector<ImGuiListClipperData> *)g);
    ImPool<ImGuiTable>::Clear((ImPool<ImGuiTable> *)g);
    ImVector<ImGuiTableTempData>::clear_destruct((ImVector<ImGuiTableTempData> *)g);
    ImVector<ImDrawChannel>::clear((ImVector<ImDrawChannel> *)g);
    ImVector<char>::clear((ImVector<char> *)g);
    ImVector<unsigned_int>::clear((ImVector<unsigned_int> *)g);
    ImGuiInputTextState::ClearFreeMemory((ImGuiInputTextState *)g);
    ImChunkStream<ImGuiWindowSettings>::clear((ImChunkStream<ImGuiWindowSettings> *)0x49c9c4);
    ImVector<ImGuiSettingsHandler>::clear((ImVector<ImGuiSettingsHandler> *)g);
    if (pIVar1->LogFile != (ImFileHandle)0x0) {
      if (pIVar1->LogFile != _stdout) {
        ImFileClose((ImFileHandle)0x49ca09);
      }
      pIVar1->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x49ca28);
    ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x49ca38);
    ImGuiTextIndex::clear((ImGuiTextIndex *)g);
    pIVar1->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown()
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *GImGui;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;
    g.DrawListSharedData.TempBuffer.clear();

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
        SaveIniSettingsToDisk(g.IO.IniFilename);

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    g.Windows.clear_delete();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;

    g.KeysRoutingTable.Clear();

    g.ColorStack.clear();
    g.StyleVarStack.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    g.Viewports.clear_delete();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.ClipperTempData.clear_destruct();

    g.Tables.Clear();
    g.TablesTempData.clear_destruct();
    g.DrawChannelsTempMergeBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();
    g.DebugLogBuf.clear();
    g.DebugLogIndex.clear();

    g.Initialized = false;
}